

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O1

Vertex * __thiscall
btConvexHullInternal::Pool<btConvexHullInternal::Vertex>::newObject
          (Pool<btConvexHullInternal::Vertex> *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  PoolArray<btConvexHullInternal::Vertex> *pPVar4;
  Vertex *pVVar5;
  long lVar6;
  Vertex *pVVar7;
  ulong uVar8;
  Vertex *pVVar9;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  
  pVVar5 = this->freeObjects;
  if (pVVar5 == (Vertex *)0x0) {
    pPVar4 = this->nextArray;
    if (pPVar4 == (PoolArray<btConvexHullInternal::Vertex> *)0x0) {
      pPVar4 = (PoolArray<btConvexHullInternal::Vertex> *)btAlignedAllocInternal(0x18,0x10);
      iVar1 = this->arraySize;
      pPVar4->size = iVar1;
      pPVar4->next = (PoolArray<btConvexHullInternal::Vertex> *)0x0;
      pVVar5 = (Vertex *)btAlignedAllocInternal((long)iVar1 << 7,0x10);
      pPVar4->array = pVVar5;
      pPVar4->next = this->arrays;
      this->arrays = pPVar4;
    }
    else {
      this->nextArray = pPVar4->next;
    }
    auVar3 = _DAT_001f55c0;
    auVar2 = _DAT_001f5270;
    pVVar5 = pPVar4->array;
    iVar1 = pPVar4->size;
    if (0 < (long)iVar1) {
      lVar6 = (long)iVar1 + -1;
      auVar10._8_4_ = (int)lVar6;
      auVar10._0_8_ = lVar6;
      auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
      pVVar7 = pVVar5 + 1;
      iVar11 = 0;
      iVar12 = 1;
      auVar10 = auVar10 ^ _DAT_001f5270;
      uVar8 = 0;
      do {
        auVar13._8_4_ = (int)uVar8;
        auVar13._0_8_ = uVar8;
        auVar13._12_4_ = (int)(uVar8 >> 0x20);
        auVar13 = (auVar13 | auVar3) ^ auVar2;
        if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                    auVar10._4_4_ < auVar13._4_4_) & 1)) {
          pVVar9 = (Vertex *)0x0;
          if (iVar11 + 1 < iVar1) {
            pVVar9 = pVVar7;
          }
          pVVar7[-1].next = pVVar9;
        }
        if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
            auVar13._12_4_ <= auVar10._12_4_) {
          pVVar9 = pVVar7 + 1;
          if (iVar1 <= iVar12 + 1) {
            pVVar9 = (Vertex *)0x0;
          }
          pVVar7->next = pVVar9;
        }
        uVar8 = uVar8 + 2;
        iVar11 = iVar11 + 2;
        iVar12 = iVar12 + 2;
        pVVar7 = pVVar7 + 2;
      } while ((iVar1 + 1U & 0xfffffffe) != uVar8);
    }
  }
  this->freeObjects = pVVar5->next;
  pVVar5->edges = (Edge *)0x0;
  pVVar5->firstNearbyFace = (Face *)0x0;
  pVVar5->next = (Vertex *)0x0;
  pVVar5->prev = (Vertex *)0x0;
  pVVar5->lastNearbyFace = (Face *)0x0;
  pVVar5->copy = -1;
  return pVVar5;
}

Assistant:

T* newObject()
				{
					T* o = freeObjects;
					if (!o)
					{
						PoolArray<T>* p = nextArray;
						if (p)
						{
							nextArray = p->next;
						}
						else
						{
							p = new(btAlignedAlloc(sizeof(PoolArray<T>), 16)) PoolArray<T>(arraySize);
							p->next = arrays;
							arrays = p;
						}
						o = p->init();
					}
					freeObjects = o->next;
					return new(o) T();
				}